

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::ReplaceAccessChainLoad
          (LocalAccessChainConvertPass *this,Instruction *address_inst,Instruction *original_load)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spv::Decoration> __l;
  uint32_t uVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  reference this_00;
  pointer this_01;
  DecorationManager *this_02;
  DebugInfoManager *this_03;
  Instruction *inst;
  Operand *pOVar4;
  uint32_t local_104;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  Operand local_c8;
  undefined1 local_98 [8];
  OperandList new_operands;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> local_68;
  undefined4 local_50;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t ldResultId;
  uint32_t varPteTypeId;
  uint32_t varId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  new_inst;
  Instruction *original_load_local;
  Instruction *address_inst_local;
  LocalAccessChainConvertPass *this_local;
  
  new_inst.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)original_load;
  uVar1 = Instruction::NumInOperands(address_inst);
  if (uVar1 == 1) {
    pIVar3 = Pass::context((Pass *)this);
    uVar1 = Instruction::result_id(address_inst);
    uVar2 = Instruction::GetSingleWordInOperand(address_inst,0);
    IRContext::ReplaceAllUsesWith(pIVar3,uVar1,uVar2);
    this_local._7_1_ = true;
  }
  else {
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              *)&varPteTypeId);
    local_4c = BuildAndAppendVarLoad
                         (this,address_inst,&ldResultId,&local_48,
                          (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                           *)&varPteTypeId);
    this_local._7_1_ = local_4c != 0;
    if (this_local._7_1_) {
      this_00 = std::
                vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ::operator[]((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                              *)&varPteTypeId,0);
      this_01 = std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::operator->(this_00);
      Instruction::UpdateDebugInfoFrom
                (this_01,(Instruction *)
                         new_inst.
                         super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pIVar3 = Pass::context((Pass *)this);
      this_02 = IRContext::get_decoration_mgr(pIVar3);
      uVar2 = Instruction::result_id
                        ((Instruction *)
                         new_inst.
                         super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar1 = local_4c;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::allocator<spv::Decoration>::allocator
                ((allocator<spv::Decoration> *)
                 ((long)&new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      __l._M_len = 1;
      __l._M_array = (iterator)
                     ((long)&new_operands.
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::vector
                (&local_68,__l,
                 (allocator_type *)
                 ((long)&new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      analysis::DecorationManager::CloneDecorations(this_02,uVar2,uVar1,&local_68);
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::~vector(&local_68);
      std::allocator<spv::Decoration>::~allocator
                ((allocator<spv::Decoration> *)
                 ((long)&new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      Instruction::InsertBefore
                ((Instruction *)
                 new_inst.
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  *)&varPteTypeId);
      pIVar3 = Pass::context((Pass *)this);
      this_03 = IRContext::get_debug_info_mgr(pIVar3);
      inst = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                       ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                        new_inst.
                        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      analysis::DebugInfoManager::AnalyzeDebugInst(this_03,inst);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_98
                );
      pOVar4 = Instruction::GetOperand
                         ((Instruction *)
                          new_inst.
                          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_98,
                 pOVar4);
      pOVar4 = Instruction::GetOperand
                         ((Instruction *)
                          new_inst.
                          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_98,
                 pOVar4);
      local_104 = local_4c;
      local_100 = &local_104;
      local_f8 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_100;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list);
      Operand::Operand(&local_c8,SPV_OPERAND_TYPE_ID,&local_f0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_98
                 ,&local_c8);
      Operand::~Operand(&local_c8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
      AppendConstantOperands
                (this,address_inst,
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_98
                );
      Instruction::SetOpcode
                ((Instruction *)
                 new_inst.
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,OpCompositeExtract);
      Instruction::ReplaceOperands
                ((Instruction *)
                 new_inst.
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)local_98);
      pIVar3 = Pass::context((Pass *)this);
      IRContext::UpdateDefUse
                (pIVar3,(Instruction *)
                        new_inst.
                        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_50 = 1;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_98
                );
    }
    else {
      local_50 = 1;
    }
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               *)&varPteTypeId);
  }
  return this_local._7_1_;
}

Assistant:

bool LocalAccessChainConvertPass::ReplaceAccessChainLoad(
    const Instruction* address_inst, Instruction* original_load) {
  // Build and append load of variable in ptrInst
  if (address_inst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  All that is
    // needed is to propagate the address.
    context()->ReplaceAllUsesWith(
        address_inst->result_id(),
        address_inst->GetSingleWordInOperand(kAccessChainPtrIdInIdx));
    return true;
  }

  std::vector<std::unique_ptr<Instruction>> new_inst;
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(address_inst, &varId, &varPteTypeId, &new_inst);
  if (ldResultId == 0) {
    return false;
  }

  new_inst[0]->UpdateDebugInfoFrom(original_load);
  context()->get_decoration_mgr()->CloneDecorations(
      original_load->result_id(), ldResultId,
      {spv::Decoration::RelaxedPrecision});
  original_load->InsertBefore(std::move(new_inst));
  context()->get_debug_info_mgr()->AnalyzeDebugInst(
      original_load->PreviousNode());

  // Rewrite |original_load| into an extract.
  Instruction::OperandList new_operands;

  // copy the result id and the type id to the new operand list.
  new_operands.emplace_back(original_load->GetOperand(0));
  new_operands.emplace_back(original_load->GetOperand(1));

  new_operands.emplace_back(
      Operand({spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}));
  AppendConstantOperands(address_inst, &new_operands);
  original_load->SetOpcode(spv::Op::OpCompositeExtract);
  original_load->ReplaceOperands(new_operands);
  context()->UpdateDefUse(original_load);
  return true;
}